

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O3

void xmrig::cryptonight_single_hash<false>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  undefined8 uVar1;
  cryptonight_ctx *input_00;
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  
  input_00 = *ctx;
  keccak(input,(int)size,input_00->state,200);
  cn_explode_scratchpad<false>((__m128i *)input_00,(__m128i *)input_00->memory);
  puVar2 = input_00->memory;
  uVar19 = *(ulong *)((long)input_00->state + 0x60);
  lVar21 = *(long *)((long)input_00->state + 0x68);
  fesetround(0x400);
  uVar17 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  if (uVar17 != 0) {
    auVar23 = *(undefined1 (*) [16])((long)input_00->state + 0x20) ^
              *(undefined1 (*) [16])input_00->state;
    auVar26 = *(undefined1 (*) [16])((long)input_00->state + 0x30) ^
              *(undefined1 (*) [16])((long)input_00->state + 0x10);
    auVar27 = *(undefined1 (*) [16])((long)input_00->state + 0x40) ^
              *(undefined1 (*) [16])((long)input_00->state + 0x50);
    do {
      auVar25 = auVar26;
      uVar11 = auVar23._0_8_;
      uVar12 = uVar11 & 0xffff0;
      auVar26 = aesenc(*(undefined1 (*) [16])(puVar2 + uVar12),auVar23);
      lVar5 = *(long *)((long)(puVar2 + (uVar12 ^ 0x30)) + 8);
      lVar6 = *(long *)(puVar2 + (uVar12 ^ 0x10));
      lVar7 = *(long *)((long)(puVar2 + (uVar12 ^ 0x10)) + 8);
      lVar8 = *(long *)(puVar2 + (uVar12 ^ 0x20));
      lVar9 = *(long *)((long)(puVar2 + (uVar12 ^ 0x20)) + 8);
      lVar24 = auVar23._8_8_;
      *(long *)(puVar2 + (uVar12 ^ 0x10)) = *(long *)(puVar2 + (uVar12 ^ 0x30)) + auVar27._0_8_;
      *(long *)((long)(puVar2 + (uVar12 ^ 0x10)) + 8) = lVar5 + auVar27._8_8_;
      *(long *)(puVar2 + (uVar12 ^ 0x20)) = lVar6 + auVar25._0_8_;
      *(long *)((long)(puVar2 + (uVar12 ^ 0x20)) + 8) = lVar7 + auVar25._8_8_;
      *(ulong *)(puVar2 + (uVar12 ^ 0x30)) = lVar8 + uVar11;
      *(long *)((long)(puVar2 + (uVar12 ^ 0x30)) + 8) = lVar9 + lVar24;
      *(undefined1 (*) [16])(puVar2 + uVar12) = auVar26 ^ auVar25;
      uVar22 = auVar26._0_8_;
      uVar18 = uVar22 & 0xffff0;
      uVar14 = lVar21 << 0x20 ^ uVar19 ^ *(ulong *)(puVar2 + uVar18);
      uVar19 = (ulong)(uint)(auVar26._0_4_ + (int)lVar21 * 2) | 0x80000001;
      uVar19 = auVar26._8_8_ % uVar19 << 0x20 | auVar26._8_8_ / uVar19 & 0xffffffff;
      dVar28 = SQRT((double)(uVar19 + uVar22 >> 0xc | 0x3ff0000000000000));
      uVar12 = (ulong)dVar28 >> 0x14;
      uVar20 = (ulong)dVar28 >> 0x13;
      lVar21 = uVar20 + (((uVar20 - uVar12) + -0x3fdffffffff) * (uVar12 - 0x3fe00000000) <
                        uVar19 + uVar22);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar14;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar22;
      uVar15 = SUB168(auVar3 * auVar4,8);
      uVar13 = SUB168(auVar3 * auVar4,0);
      uVar22 = *(ulong *)(puVar2 + (uVar18 ^ 0x10));
      uVar10 = *(ulong *)((long)(puVar2 + (uVar18 ^ 0x10)) + 8);
      uVar16 = uVar18 ^ 0x20;
      uVar12 = *(ulong *)(puVar2 + uVar16);
      uVar20 = *(ulong *)(puVar2 + uVar16 + 8);
      lVar5 = *(long *)((long)(puVar2 + (uVar18 ^ 0x30)) + 8);
      lVar6 = *(long *)(puVar2 + uVar16);
      lVar7 = *(long *)((long)(puVar2 + uVar16) + 8);
      uVar1 = *(undefined8 *)(puVar2 + uVar18 + 8);
      *(long *)(puVar2 + (uVar18 ^ 0x10)) = auVar27._0_8_ + *(long *)(puVar2 + (uVar18 ^ 0x30));
      *(long *)((long)(puVar2 + (uVar18 ^ 0x10)) + 8) = auVar27._8_8_ + lVar5;
      *(ulong *)(puVar2 + uVar16) = (uVar15 ^ uVar22) + auVar25._0_8_;
      *(ulong *)((long)(puVar2 + uVar16) + 8) = (uVar13 ^ uVar10) + auVar25._8_8_;
      *(ulong *)(puVar2 + (uVar18 ^ 0x30)) = lVar6 + uVar11;
      *(long *)((long)(puVar2 + (uVar18 ^ 0x30)) + 8) = lVar7 + lVar24;
      auVar27._0_8_ = (uVar15 ^ uVar12) + uVar11;
      auVar27._8_8_ = (uVar13 ^ uVar20) + lVar24;
      *(undefined1 (*) [16])(puVar2 + uVar18) = auVar27;
      auVar23._8_8_ = uVar1;
      auVar23._0_8_ = uVar14;
      auVar23 = auVar23 ^ auVar27;
      uVar17 = uVar17 - 1;
      auVar27 = auVar25;
    } while (uVar17 != 0);
  }
  cn_implode_scratchpad<false>((__m128i *)input_00->memory,(__m128i *)input_00);
  keccakf((uint64_t *)input_00,0x18);
  switch((byte)*(longlong *)input_00->state & 3) {
  case 0:
    blake256_hash(output,input_00->state,200);
    return;
  case 1:
    groestl(input_00->state,0x640,output);
    return;
  case 2:
    jh_hash(0x100,input_00->state,0x640,output);
    return;
  case 3:
    xmr_skein(input_00->state,output);
    return;
  }
}

Assistant:

inline void cryptonight_single_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input, size, ctx[0]->state);
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->state), reinterpret_cast<__m128i *>(ctx[0]->memory));

    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint8_t *l0   = ctx[0]->memory;

    VARIANT2_INIT(0);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t al0  = h0[0] ^ h0[4];
    uint64_t ah0  = h0[1] ^ h0[5];
    uint64_t idx0 = al0;
    __m128i bx0   = _mm_set_epi64x(static_cast<int64_t>(h0[3] ^ h0[7]), static_cast<int64_t>(h0[2] ^ h0[6]));
    __m128i bx1   = _mm_set_epi64x(static_cast<int64_t>(h0[9] ^ h0[11]), static_cast<int64_t>(h0[8] ^ h0[10]));

    for (size_t i = 0; i < iters; i++) {
        __m128i cx;
        if (!SOFT_AES) {
            cx = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(static_cast<int64_t>(ah0), static_cast<int64_t>(al0));
        if (SOFT_AES) {
            cx = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx = _mm_aesenc_si128(cx, ax0);
        }

        cryptonight_monero_tweak(reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]), l0, idx0 & MASK, ax0, bx0, bx1, cx);

        idx0 = static_cast<uint64_t>(_mm_cvtsi128_si64(cx));

        uint64_t hi, lo, cl, ch;
        cl = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[0];
        ch = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[1];

        VARIANT2_INTEGER_MATH(0, cl, cx);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx0, bx1, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[0] = al0;
        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;
        bx1 = bx0;

        bx0 = cx;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->memory), reinterpret_cast<__m128i *>(ctx[0]->state));
    keccakf(h0, 24);
    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
}